

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O0

HeaderChunk rlib::midi::Smf::Inner::read<rlib::midi::Smf::Inner::HeaderChunk>(istream *is)

{
  ulong uVar1;
  runtime_error *this;
  char *in_RDI;
  HeaderChunk HVar2;
  type buf;
  HeaderChunk local_e;
  
  HeaderChunk::HeaderChunk(&local_e);
  std::istream::read(in_RDI,(long)&local_e);
  uVar1 = std::istream::gcount();
  if (uVar1 < 0xe) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"size error");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  HVar2.dataLength._2_2_ = local_e.dataLength._2_2_;
  HVar2._0_6_ = local_e._0_6_;
  HVar2.format = local_e.format;
  HVar2.trackCount = local_e.trackCount;
  HVar2.division = local_e.division;
  return HVar2;
}

Assistant:

static T read(std::istream& is) {
		typename std::remove_const<T>::type buf;
		if (is.read(reinterpret_cast<char*>(&buf), sizeof(buf)).gcount() < sizeof(buf)) {
			throw std::runtime_error("size error");
		}
		return buf;
	}